

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O1

void nk_end(nk_context *ctx)

{
  nk_command_buffer *b;
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  uint uVar8;
  nk_panel_type nVar9;
  nk_window *pnVar10;
  nk_panel *pnVar11;
  nk_window *pnVar12;
  nk_user_font *font;
  _func_void_nk_command_buffer_ptr_nk_handle *p_Var13;
  undefined1 auVar14 [16];
  nk_vec2 nVar15;
  bool bVar16;
  nk_panel *pnVar17;
  int iVar18;
  nk_panel *pnVar19;
  uint *puVar20;
  long lVar21;
  nk_panel *pnVar22;
  nk_page_element *pe;
  nk_window *pnVar23;
  nk_context *in;
  nk_property_state *__s;
  nk_edit_state *__s_00;
  ulong uVar24;
  ulong uVar25;
  bool bVar26;
  float fVar27;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dd;
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  float fVar32;
  nk_rect r;
  nk_rect rect;
  nk_rect rect_00;
  nk_rect rect_01;
  nk_rect rect_02;
  nk_rect scroll;
  nk_rect bounds;
  nk_rect bounds_00;
  nk_rect rect_03;
  nk_rect r_00;
  nk_flags state;
  nk_rect cursor;
  nk_rect empty_east;
  nk_rect empty_west;
  nk_rect local_118;
  float local_104;
  float local_100;
  nk_flags local_fc;
  undefined1 local_f8 [16];
  undefined1 local_e8 [16];
  undefined1 local_d8 [16];
  undefined1 local_c8 [16];
  undefined1 local_b8 [16];
  undefined1 local_a8 [16];
  nk_rect local_98;
  undefined1 local_88 [16];
  float local_78;
  float fStack_74;
  float fStack_70;
  float fStack_6c;
  undefined1 local_68 [16];
  nk_rect local_50;
  nk_rect local_40;
  
  if (ctx == (nk_context *)0x0) {
    __assert_fail("ctx",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Rodousse[P]SSSGems/third_party/glfw/deps/nuklear.h"
                  ,0x3fca,"void nk_end(struct nk_context *)");
  }
  pnVar10 = ctx->current;
  if (pnVar10 == (nk_window *)0x0) {
    __assert_fail("ctx->current && \"if this triggers you forgot to call `nk_begin`\"",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Rodousse[P]SSSGems/third_party/glfw/deps/nuklear.h"
                  ,0x3fcb,"void nk_end(struct nk_context *)");
  }
  pnVar11 = pnVar10->layout;
  if ((pnVar11 == (nk_panel *)0x0) ||
     ((pnVar11->type == NK_PANEL_WINDOW && ((pnVar10->flags & 0x2000) != 0)))) goto LAB_0012de92;
  b = &pnVar10->buffer;
  in = (nk_context *)0x0;
  if ((pnVar11->flags & 0x1400) == 0) {
    in = ctx;
  }
  if ((pnVar11->type &
      (NK_PANEL_TOOLTIP|NK_PANEL_MENU|NK_PANEL_COMBO|NK_PANEL_CONTEXTUAL|NK_PANEL_POPUP|
      NK_PANEL_GROUP)) == NK_PANEL_NONE) {
    r.w = 16384.0;
    r.h = 16384.0;
    r.x = -8192.0;
    r.y = -8192.0;
    nk_push_scissor(b,r);
  }
  local_d8 = ZEXT416((uint)(ctx->style).window.scrollbar_size.x);
  local_e8 = ZEXT416((uint)(ctx->style).window.scrollbar_size.y);
  nVar15 = nk_panel_get_padding(&ctx->style,pnVar11->type);
  auVar14._8_4_ = extraout_XMM0_Dc;
  auVar14._0_4_ = nVar15.x;
  auVar14._4_4_ = nVar15.y;
  auVar14._12_4_ = extraout_XMM0_Dd;
  fVar27 = (pnVar11->row).height + pnVar11->at_y;
  pnVar11->at_y = fVar27;
  local_f8 = auVar14;
  if ((pnVar11->flags & 0x8800) == 0x800) {
    fVar29 = (pnVar11->bounds).y;
    if (fVar27 < (pnVar11->bounds).h + fVar29) {
      (pnVar11->bounds).h = fVar27 - fVar29;
    }
    local_f8._4_4_ = nVar15.y;
    rect.y = fVar29;
    rect.x = (pnVar10->bounds).x;
    rect.h = (float)local_f8._4_4_;
    rect.w = (pnVar10->bounds).w;
    nk_fill_rect(b,rect,0.0,(ctx->style).window.background);
    rect_00.w = pnVar11->border + (float)local_f8._0_4_;
    rect_00.y = (pnVar11->bounds).y;
    rect_00.x = (pnVar10->bounds).x;
    rect_00.h = (pnVar11->bounds).h;
    nk_fill_rect(b,rect_00,0.0,(ctx->style).window.background);
    rect_01.x = ((pnVar11->bounds).x + (pnVar11->bounds).w) - pnVar11->border;
    fVar27 = pnVar11->border + (float)local_f8._0_4_;
    if ((*pnVar11->offset_y == 0) && ((pnVar11->flags & 0x20) == 0)) {
      fVar27 = fVar27 + (float)local_d8._0_4_;
    }
    rect_01.y = (pnVar11->bounds).y;
    rect_01.h = (pnVar11->bounds).h;
    rect_01.w = fVar27;
    nk_fill_rect(b,rect_01,0.0,(ctx->style).window.background);
    if ((*pnVar11->offset_x != 0) && ((pnVar11->flags & 0x20) == 0)) {
      rect_02.y = (pnVar11->bounds).y + (pnVar11->bounds).h;
      rect_02.x = (pnVar10->bounds).x;
      rect_02.h = (float)local_e8._0_4_;
      rect_02.w = (pnVar10->bounds).w;
      nk_fill_rect(b,rect_02,0.0,(ctx->style).window.background);
    }
  }
  if (((pnVar11->flags & 0x8020) == 0) &&
     (pnVar10->scrollbar_hiding_timer <= 4.0 && pnVar10->scrollbar_hiding_timer != 4.0)) {
    if ((pnVar11->type &
        (NK_PANEL_TOOLTIP|NK_PANEL_MENU|NK_PANEL_COMBO|NK_PANEL_CONTEXTUAL|NK_PANEL_POPUP|
        NK_PANEL_GROUP)) == NK_PANEL_NONE) {
      if (pnVar10 == ctx->active) {
        bVar26 = pnVar11->has_scrolling != 0;
      }
      else {
        bVar26 = false;
      }
      if (in != (nk_context *)0x0) {
        bVar16 = bVar26;
        if ((in->input).mouse.scroll_delta.y <= 0.0) {
          bVar16 = (bool)(0.0 < (in->input).mouse.scroll_delta.x & bVar26);
        }
        if (bVar16 != false) {
          pnVar10->scrolled = 1;
          goto LAB_0012d48b;
        }
      }
      pnVar10->scrolled = 0;
    }
    else {
      pnVar19 = pnVar10->layout;
      pnVar17 = pnVar19;
      do {
        pnVar22 = pnVar17;
        pnVar17 = pnVar22->parent;
        pnVar12 = pnVar10;
      } while (pnVar22->parent != (nk_panel *)0x0);
      do {
        pnVar23 = pnVar12;
        pnVar12 = pnVar23->parent;
      } while (pnVar12 != (nk_window *)0x0);
      if (((pnVar23 != ctx->active) || (pnVar11->has_scrolling == 0)) || (in == (nk_context *)0x0))
      goto LAB_0012d341;
      uVar1 = (pnVar11->bounds).x;
      uVar5 = (pnVar11->bounds).y;
      fVar27 = (in->input).mouse.pos.x;
      bVar26 = false;
      if (((float)uVar1 <= fVar27) &&
         (uVar2 = (pnVar11->bounds).w, uVar6 = (pnVar11->bounds).h,
         fVar27 < (float)uVar1 + (float)uVar2)) {
        fVar27 = (in->input).mouse.pos.y;
        bVar26 = false;
        if (((float)uVar5 <= fVar27) && (fVar27 < (float)uVar5 + (float)uVar6)) {
          fVar27 = (pnVar22->clip).x;
          fVar29 = (pnVar11->bounds).x;
          if ((fVar27 <= (pnVar11->bounds).w + fVar29) && (fVar29 <= fVar27 + (pnVar22->clip).w)) {
            fVar27 = (pnVar22->clip).y;
            fVar29 = (pnVar11->bounds).y;
            if ((fVar27 <= (pnVar11->bounds).h + fVar29) && (fVar29 <= fVar27 + (pnVar22->clip).h))
            {
              for (; pnVar19->parent != (nk_panel *)0x0; pnVar19 = pnVar19->parent) {
                pnVar19->has_scrolling = 0;
              }
              pnVar19->has_scrolling = 0;
              bVar26 = true;
              goto LAB_0012d48b;
            }
          }
LAB_0012d341:
          bVar26 = false;
        }
      }
    }
LAB_0012d48b:
    local_118.x = 0.0;
    fVar27 = (pnVar11->bounds).y;
    fVar29 = (pnVar11->bounds).h;
    scroll.x = (pnVar11->bounds).x + (pnVar11->bounds).w + (float)local_f8._0_4_;
    scroll.y = fVar27;
    scroll.h = fVar29;
    scroll.w = (float)local_d8._0_4_;
    fVar27 = nk_do_scrollbarv((nk_flags *)&local_118,b,scroll,(uint)bVar26,(float)*pnVar11->offset_y
                              ,(float)(int)(pnVar11->at_y - fVar27),fVar29 * 0.1,fVar29 * 0.01,
                              &(ctx->style).scrollv,&in->input,(ctx->style).font);
    *pnVar11->offset_y = (nk_uint)(long)fVar27;
    if ((in != (nk_context *)0x0) && (bVar26 != false)) {
      (in->input).mouse.scroll_delta.y = 0.0;
    }
    local_fc = 0;
    local_118.y = (pnVar11->bounds).y + (pnVar11->bounds).h;
    fVar27 = (pnVar11->bounds).x;
    fVar29 = pnVar11->max_x;
    fVar30 = (pnVar11->bounds).w;
    fVar28 = (float)(int)(fVar29 - fVar27);
    font = (ctx->style).font;
    local_118.h = 1.0;
    if (1.0 <= (float)local_e8._0_4_) {
      local_118.h = (float)local_e8._0_4_;
    }
    fVar32 = local_118.h + local_118.h;
    local_118.w = fVar32;
    if (fVar32 <= fVar30) {
      local_118.w = fVar30;
    }
    fVar30 = 0.0;
    local_118.x = fVar27;
    if (local_118.w < fVar28) {
      fVar31 = (float)*pnVar11->offset_x;
      fVar30 = fVar29 * 0.05;
      local_a8 = ZEXT416((uint)fVar28);
      local_50.h = local_118.h;
      if ((ctx->style).scrollh.show_buttons != 0) {
        local_b8 = ZEXT416((uint)fVar32);
        local_68 = ZEXT416((uint)local_118.w);
        local_104 = fVar30;
        if (fVar29 * 0.005 <= fVar30) {
          local_104 = fVar29 * 0.005;
        }
        bounds.y = local_118.y;
        bounds.x = fVar27;
        local_88 = ZEXT416((uint)local_118.y);
        local_c8 = ZEXT416((uint)local_118.h);
        bounds.h = local_118.h;
        bounds.w = local_118.h;
        local_100 = fVar30;
        local_78 = local_118.h;
        fStack_74 = local_118.h;
        fStack_70 = local_118.h;
        fStack_6c = local_118.h;
        iVar18 = nk_do_button_symbol((nk_flags *)&local_98,b,bounds,(ctx->style).scrollh.dec_symbol,
                                     NK_BUTTON_REPEATER,&(ctx->style).scrollh.dec_button,&in->input,
                                     font);
        fVar29 = 0.0;
        if (iVar18 != 0) {
          fVar29 = local_104;
        }
        local_b8._4_4_ = local_68._4_4_;
        local_b8._0_4_ = (float)local_68._0_4_ - (float)local_b8._0_4_;
        local_b8._8_4_ = local_68._8_4_;
        local_b8._12_4_ = local_68._12_4_;
        fVar31 = fVar31 - fVar29;
        bounds_00.x = ((float)local_68._0_4_ + fVar27) - (float)local_c8._0_4_;
        bounds_00.h = fStack_74;
        bounds_00.w = local_78;
        bounds_00.y = (float)local_88._0_4_;
        iVar18 = nk_do_button_symbol((nk_flags *)&local_98,b,bounds_00,
                                     (ctx->style).scrollh.inc_symbol,NK_BUTTON_REPEATER,
                                     &(ctx->style).scrollh.inc_button,&in->input,font);
        if (iVar18 != 0) {
          fVar31 = fVar31 + local_104;
        }
        local_118.x = fVar27 + (float)local_c8._0_4_;
        local_118.w = (float)local_b8._0_4_;
        fVar28 = (float)local_a8._0_4_;
        fVar30 = local_100;
        local_50.h = (float)local_c8._0_4_;
      }
      fVar27 = local_118.w;
      if (local_118.w <= fVar30) {
        fVar30 = local_118.w;
      }
      if (fVar28 - local_118.w <= fVar31) {
        fVar31 = fVar28 - local_118.w;
      }
      fVar29 = 0.0;
      if (0.0 <= fVar31) {
        fVar29 = fVar31;
      }
      fVar32 = (ctx->style).scrollh.border;
      fVar31 = (ctx->style).scrollh.padding.x;
      local_98.x = (fVar29 / fVar28) * local_118.w + local_118.x + fVar32 + fVar31;
      local_98.w = (local_118.w / fVar28) * local_118.w - (fVar31 + fVar31 + fVar32 + fVar32);
      fVar31 = (ctx->style).scrollh.padding.y;
      local_98.y = fVar32 + local_118.y + fVar31;
      local_98.h = local_50.h - (fVar31 + fVar31 + fVar32 + fVar32);
      local_c8._0_4_ = local_118.x;
      local_40.x = local_118.x;
      local_40.y = local_118.y;
      local_50.x = local_98.w + local_98.x;
      local_40.w = local_98.x - local_118.x;
      local_50.y = local_118.y;
      local_50.w = (local_118.w + local_118.x) - local_50.x;
      local_40.h = local_50.h;
      fVar30 = nk_scrollbar_behavior
                         (&local_fc,&in->input,(uint)bVar26,&local_118,&local_98,&local_40,&local_50
                          ,fVar29,fVar28,fVar30,NK_HORIZONTAL);
      local_98.x = (fVar30 / (float)local_a8._0_4_) * fVar27 + (float)local_c8._0_4_;
      p_Var13 = (ctx->style).scrollh.draw_begin;
      if (p_Var13 != (_func_void_nk_command_buffer_ptr_nk_handle *)0x0) {
        (*p_Var13)(b,(ctx->style).scrollh.userdata);
      }
      nk_draw_scrollbar(b,local_fc,&(ctx->style).scrollh,&local_118,&local_98);
      p_Var13 = (ctx->style).scrollh.draw_end;
      if (p_Var13 != (_func_void_nk_command_buffer_ptr_nk_handle *)0x0) {
        (*p_Var13)(b,(ctx->style).scrollh.userdata);
      }
    }
    *pnVar11->offset_x = (nk_uint)(long)fVar30;
  }
  if ((pnVar10->flags & 0x80) == 0) {
LAB_0012d916:
    pnVar10->scrollbar_hiding_timer = 0.0;
  }
  else {
    fVar27 = (ctx->input).mouse.delta.x;
    if ((((fVar27 != 0.0) || (NAN(fVar27))) || (fVar27 = (ctx->input).mouse.delta.y, fVar27 != 0.0))
       || (NAN(fVar27))) {
      bVar26 = false;
    }
    else {
      bVar26 = (ctx->input).mouse.scroll_delta.y == 0.0;
    }
    iVar18 = nk_window_is_hovered(ctx);
    if ((!(bool)(bVar26 & iVar18 != 0)) && (iVar18 != 0 || (ctx->last_widget_state & 2) != 0))
    goto LAB_0012d916;
    pnVar10->scrollbar_hiding_timer = ctx->delta_time_seconds + pnVar10->scrollbar_hiding_timer;
  }
  uVar8 = pnVar11->flags;
  if ((uVar8 & 1) != 0) {
    nVar9 = pnVar11->type;
    lVar21 = 0x1e2c;
    if ((int)nVar9 < 0x20) {
      if (nVar9 == NK_PANEL_GROUP) {
        lVar21 = 0x1e40;
      }
      else if (nVar9 == NK_PANEL_POPUP) {
        lVar21 = 0x1e30;
      }
      else if (nVar9 == NK_PANEL_CONTEXTUAL) {
        lVar21 = 0x1e38;
      }
    }
    else if (nVar9 == NK_PANEL_COMBO) {
      lVar21 = 0x1e34;
    }
    else if ((nVar9 == NK_PANEL_MENU) || (nVar9 == NK_PANEL_TOOLTIP)) {
      lVar21 = 0x1e3c;
    }
    if ((short)uVar8 < 0) {
      fVar27 = (ctx->style).window.border + (pnVar10->bounds).y + pnVar11->header_height;
    }
    else if ((uVar8 >> 0xb & 1) == 0) {
      fVar27 = (pnVar10->bounds).y + (pnVar10->bounds).h;
    }
    else {
      fVar27 = (pnVar11->bounds).y + (pnVar11->bounds).h + pnVar11->footer_height;
    }
    uVar3 = (pnVar10->bounds).x;
    uVar7 = (pnVar10->bounds).y;
    rect_03.y = (float)uVar7;
    rect_03.x = (float)uVar3;
    uVar4 = (pnVar10->bounds).w;
    rect_03.h = fVar27 - (pnVar10->bounds).y;
    rect_03.w = (float)uVar4;
    nk_stroke_rect(b,rect_03,0.0,pnVar11->border,
                   *(nk_color *)((long)&(ctx->input).keyboard.keys[0].down + lVar21));
  }
  if ((in != (nk_context *)0x0) && (uVar8 = pnVar11->flags, (uVar8 & 0x8004) == 4)) {
    fVar27 = (pnVar11->bounds).x;
    fVar29 = (pnVar11->bounds).y + (pnVar11->bounds).h;
    if ((uVar8 >> 9 & 1) == 0) {
      local_f8._0_4_ = fVar27 + (pnVar11->bounds).w + (float)local_f8._0_4_;
    }
    else {
      local_f8._0_4_ = fVar27 + (float)local_f8._0_4_ * -0.5;
    }
    if ((uVar8 & 0x20) != 0) {
      local_f8._0_4_ = (float)local_f8._0_4_ - (float)local_d8._0_4_;
    }
    local_f8._4_4_ = fVar29;
    local_f8._8_8_ = 0;
    if ((ctx->style).window.scaler.type == NK_STYLE_ITEM_IMAGE) {
      r_00.y = fVar29;
      r_00.x = (float)local_f8._0_4_;
      r_00.h = (float)local_e8._0_4_;
      r_00.w = (float)local_d8._0_4_;
      nk_draw_image(b,r_00,&(ctx->style).window.scaler.data.image,(nk_color)0xffffffff);
    }
    else {
      fVar30 = (float)local_d8._0_4_ + (float)local_f8._0_4_;
      fVar27 = (float)local_f8._0_4_;
      if ((uVar8 >> 9 & 1) == 0) {
        fVar27 = fVar30;
        fVar30 = (float)local_f8._0_4_;
      }
      nk_fill_triangle(b,fVar27,fVar29,fVar27,fVar29 + (float)local_e8._0_4_,fVar30,
                       fVar29 + (float)local_e8._0_4_,(ctx->style).window.scaler.data.color);
    }
    if ((pnVar10->flags & 0x1000) == 0) {
      iVar18 = (in->input).mouse.buttons[0].down;
      fVar27 = (in->input).mouse.buttons[0].clicked_pos.x;
      bVar26 = false;
      if (((float)local_f8._0_4_ <= fVar27) &&
         (bVar26 = false, fVar27 < (float)local_d8._0_4_ + (float)local_f8._0_4_)) {
        fVar27 = (in->input).mouse.buttons[0].clicked_pos.y;
        bVar26 = iVar18 == 1 &&
                 (fVar27 < (float)local_e8._0_4_ + (float)local_f8._4_4_ &&
                 (float)local_f8._4_4_ <= fVar27);
      }
      if ((iVar18 != 0) && (bVar26)) {
        fVar27 = (ctx->style).window.min_size.x;
        fVar29 = (ctx->style).window.min_size.y;
        fVar30 = (in->input).mouse.delta.x;
        uVar8 = pnVar11->flags;
        fVar28 = fVar30;
        if ((uVar8 >> 9 & 1) != 0) {
          fVar28 = -fVar30;
          (pnVar10->bounds).x = (pnVar10->bounds).x + fVar30;
        }
        fVar31 = (pnVar10->bounds).w + fVar28;
        fVar32 = (float)local_f8._0_4_;
        if ((fVar27 <= fVar31) &&
           ((fVar28 < 0.0 || ((0.0 < fVar28 && ((float)local_f8._0_4_ <= (in->input).mouse.pos.x))))
           )) {
          (pnVar10->bounds).w = fVar31;
          fVar32 = fVar30 + (float)local_f8._0_4_;
        }
        fVar27 = (float)local_f8._4_4_;
        if ((uVar8 >> 0xb & 1) == 0) {
          fVar30 = (in->input).mouse.delta.y;
          fVar28 = (pnVar10->bounds).h + fVar30;
          if ((fVar29 < fVar28) &&
             ((fVar30 < 0.0 ||
              ((0.0 < fVar30 && ((float)local_f8._4_4_ <= (in->input).mouse.pos.y)))))) {
            (pnVar10->bounds).h = fVar28;
            fVar27 = (float)local_f8._4_4_ + fVar30;
          }
        }
        (ctx->style).cursor_active = (ctx->style).cursors[6];
        (in->input).mouse.buttons[0].clicked_pos.x = (float)local_d8._0_4_ * 0.5 + fVar32;
        (in->input).mouse.buttons[0].clicked_pos.y = (float)local_e8._0_4_ * 0.5 + fVar27;
      }
    }
  }
  if ((pnVar11->type &
      (NK_PANEL_TOOLTIP|NK_PANEL_MENU|NK_PANEL_COMBO|NK_PANEL_CONTEXTUAL|NK_PANEL_POPUP|
      NK_PANEL_GROUP)) == NK_PANEL_NONE) {
    if ((pnVar11->flags & 0x2000) == 0) {
      (pnVar10->buffer).end = (ctx->memory).allocated;
      if ((pnVar10->popup).buf.active != 0) {
        *(nk_size *)((long)(ctx->memory).memory.ptr + (pnVar10->popup).buf.parent + 8) =
             (pnVar10->popup).buf.end;
      }
    }
    else {
      (pnVar10->buffer).begin = 0;
      (pnVar10->buffer).end = 0;
      (pnVar10->buffer).last = 0;
      (pnVar10->buffer).clip = nk_null_rect;
    }
  }
  if ((pnVar11->flags >> 0x10 & 1) != 0) {
    pnVar11->flags = pnVar11->flags & 0xfffeefff;
  }
  pnVar10->flags = pnVar11->flags;
  iVar18 = (pnVar10->property).active;
  if (((iVar18 == 0) || ((pnVar10->property).old == (pnVar10->property).seq)) ||
     (iVar18 != (pnVar10->property).prev)) {
    (pnVar10->property).old = (pnVar10->property).seq;
    (pnVar10->property).prev = iVar18;
    (pnVar10->property).seq = 0;
  }
  else {
    __s = &pnVar10->property;
    uVar24 = (ulong)__s & 3;
    if (uVar24 == 0) {
      uVar25 = 0x68;
    }
    else {
      memset(__s,0,4 - uVar24);
      uVar25 = uVar24 | 100;
      __s = (nk_property_state *)((long)__s + (4 - uVar24));
    }
    uVar24 = (ulong)((uint)uVar25 & 0xfffffffc);
    memset(__s,0,uVar24);
    if ((uVar25 & 3) != 0) {
      memset(__s->buffer + (uVar24 - 8),0,uVar25 & 3);
    }
  }
  iVar18 = (pnVar10->edit).active;
  if (((iVar18 == 0) || ((pnVar10->edit).old == (pnVar10->edit).seq)) ||
     (iVar18 != (pnVar10->edit).prev)) {
    (pnVar10->edit).old = (pnVar10->edit).seq;
    (pnVar10->edit).prev = iVar18;
    (pnVar10->edit).seq = 0;
  }
  else {
    __s_00 = &pnVar10->edit;
    uVar24 = (ulong)__s_00 & 3;
    if (uVar24 == 0) {
      uVar25 = 0x2c;
    }
    else {
      memset(__s_00,0,4 - uVar24);
      uVar25 = uVar24 | 0x28;
      __s_00 = (nk_edit_state *)((long)__s_00 + (4 - uVar24));
    }
    uVar24 = (ulong)((uint)uVar25 & 0xfffffffc);
    memset(__s_00,0,uVar24);
    if ((uVar25 & 3) != 0) {
      memset((void *)((long)&__s_00->name + uVar24),0,uVar25 & 3);
    }
  }
  if (((pnVar10->popup).active_con == 0) || ((pnVar10->popup).con_old == (pnVar10->popup).con_count)
     ) {
    puVar20 = &(pnVar10->popup).con_count;
    (pnVar10->popup).con_old = (pnVar10->popup).con_count;
  }
  else {
    puVar20 = &(pnVar10->popup).active_con;
    (pnVar10->popup).con_count = 0;
    (pnVar10->popup).con_old = 0;
  }
  *puVar20 = 0;
  (pnVar10->popup).combo_count = 0;
  if ((pnVar11->row).tree_depth != 0) {
    __assert_fail("!layout->row.tree_depth",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Rodousse[P]SSSGems/third_party/glfw/deps/nuklear.h"
                  ,0x3e9c,"void nk_panel_end(struct nk_context *)");
  }
  nk_free_page_element(ctx,(nk_page_element *)ctx->current->layout);
LAB_0012de92:
  ctx->current = (nk_window *)0x0;
  return;
}

Assistant:

NK_API void
nk_end(struct nk_context *ctx)
{
    struct nk_panel *layout;
    NK_ASSERT(ctx);
    NK_ASSERT(ctx->current && "if this triggers you forgot to call `nk_begin`");
    if (!ctx || !ctx->current)
        return;

    layout = ctx->current->layout;
    if (!layout || (layout->type == NK_PANEL_WINDOW && (ctx->current->flags & NK_WINDOW_HIDDEN))) {
        ctx->current = 0;
        return;
    }
    nk_panel_end(ctx);
    nk_free_panel(ctx, ctx->current->layout);
    ctx->current = 0;
}